

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::ApplyMigrationData(CWallet *this,MigrationData *data,bilingual_str *error)

{
  _Base_ptr dest_00;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *this_00;
  pointer puVar1;
  CWallet *pCVar2;
  int64_t nOrderPosNext;
  WalletBatch *this_01;
  string_view func;
  string original;
  bilingual_str lhs;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> this_02;
  pointer ppVar3;
  pointer pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  isminetype iVar8;
  LegacyDataSPKM *this_03;
  size_type sVar9;
  WalletDatabase *pWVar10;
  mapped_type *wtx;
  _Base_ptr p_Var11;
  mapped_type *this_04;
  _Rb_tree_node_base *p_Var12;
  size_type sVar13;
  char *in_RCX;
  AddressPurpose p;
  long lVar14;
  pointer ppVar15;
  pointer address;
  int iVar16;
  key_type *hash;
  element_type *peVar17;
  bilingual_str *pbVar18;
  shared_ptr<wallet::CWallet> *psVar19;
  pointer puVar20;
  long lVar21;
  long in_FS_OFFSET;
  string_view msg;
  string_view file;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 uVar22;
  undefined8 in_stack_fffffffffffffd90;
  char *pcVar23;
  undefined8 in_stack_fffffffffffffd98;
  CWallet *this_05;
  uint uVar24;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *p_Var25;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *p_Var26;
  _Base_ptr p_Var27;
  CAddressBookData *strName;
  undefined8 in_stack_fffffffffffffdc0;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> watchonly_batch;
  vector<uint256,_std::allocator<uint256>_> txids_to_delete;
  CBlockLocator best_block_locator;
  DescriptorScriptPubKeyMan *local_1f0;
  undefined8 local_1e8;
  char *pcStack_1e0;
  unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> batch;
  vector<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
  wallets_vec;
  vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  dests_to_delete;
  bilingual_str local_168;
  CTxDestination dest;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock68;
  __node_base local_b0;
  set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  not_migrated_dests;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = GetLegacyDataSPKM(this);
  if (this_03 == (LegacyDataSPKM *)0x0) {
    local_1e8 = 0x12;
    pcStack_1e0 = "ApplyMigrationData";
    uVar22 = 0x12;
    pcVar23 = "ApplyMigrationData";
    func._M_str = "ApplyMigrationData";
    func._M_len = 0x12;
    msg._M_str = "Error: Legacy wallet data missing";
    msg._M_len = 0x21;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp";
    file._M_len = 0x5a;
    StrFormatInternalBug_abi_cxx11_(&local_58,msg,file,0xfd9,func);
    original._M_string_length = (size_type)pcVar23;
    original._M_dataplus._M_p = (pointer)uVar22;
    original.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
    original.field_2._8_8_ = this;
    Untranslated((bilingual_str *)&dest,original);
    bilingual_str::operator=(error,(bilingual_str *)&dest);
    bilingual_str::~bilingual_str((bilingual_str *)&dest);
    std::__cxx11::string::~string((string *)&local_58);
    bVar5 = false;
    goto LAB_009ad452;
  }
  not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_header;
  not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       not_migrated_dests._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  LegacyDataSPKM::GetNotMineScriptPubKeys
            ((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
              *)&criticalblock68,this_03);
  for (; local_b0._M_nxt != (_Hash_node_base *)0x0; local_b0._M_nxt = (local_b0._M_nxt)->_M_nxt) {
    dest.
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_u._16_8_ = 0;
    dest.
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_u._24_8_ = 0;
    dest.
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_u._0_8_ = 0;
    dest.
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_u._8_8_ = 0;
    dest.
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_index = '\0';
    bVar5 = ExtractDestination((CScript *)(local_b0._M_nxt + 1),&dest);
    if (bVar5) {
      std::
      _Rb_tree<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>,std::_Identity<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>,std::less<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>,std::allocator<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
      ::
      _M_emplace_unique<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>&>
                ((_Rb_tree<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>,std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>,std::_Identity<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>,std::less<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>,std::allocator<std::variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>>>
                  *)&not_migrated_dests,
                 (variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                  *)&dest);
    }
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&dest);
  }
  std::
  _Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<CScript,_CScript,_std::allocator<CScript>,_std::__detail::_Identity,_std::equal_to<CScript>,_SaltedSipHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&criticalblock68);
  puVar1 = (data->desc_spkms).
           super__Vector_base<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>,_std::allocator<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->m_spk_managers;
  for (puVar20 = (data->desc_spkms).
                 super__Vector_base<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>,_std::allocator<std::unique_ptr<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar1; puVar20 = puVar20 + 1
      ) {
    (**(code **)((long)(((puVar20->_M_t).
                         super___uniq_ptr_impl<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::DescriptorScriptPubKeyMan_*,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                         .super__Head_base<0UL,_wallet::DescriptorScriptPubKeyMan_*,_false>.
                        _M_head_impl)->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan + 0xd0))(&dest);
    sVar9 = std::
            map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
            ::count(this_00,(key_type *)&dest);
    if (sVar9 != 0) {
      _((bilingual_str *)&dest,(ConstevalStringLiteral)0xe1d554);
      bilingual_str::operator=(error,(bilingual_str *)&dest);
      bilingual_str::~bilingual_str((bilingual_str *)&dest);
      goto LAB_009ace27;
    }
    (**(code **)((long)(((puVar20->_M_t).
                         super___uniq_ptr_impl<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wallet::DescriptorScriptPubKeyMan_*,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                         .super__Head_base<0UL,_wallet::DescriptorScriptPubKeyMan_*,_false>.
                        _M_head_impl)->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan + 0xd0))(&dest);
    local_1f0 = (puVar20->_M_t).
                super___uniq_ptr_impl<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                ._M_t.
                super__Tuple_impl<0UL,_wallet::DescriptorScriptPubKeyMan_*,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
                .super__Head_base<0UL,_wallet::DescriptorScriptPubKeyMan_*,_false>._M_head_impl;
    (puVar20->_M_t).
    super___uniq_ptr_impl<wallet::DescriptorScriptPubKeyMan,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
    ._M_t.
    super__Tuple_impl<0UL,_wallet::DescriptorScriptPubKeyMan_*,_std::default_delete<wallet::DescriptorScriptPubKeyMan>_>
    .super__Head_base<0UL,_wallet::DescriptorScriptPubKeyMan_*,_false>._M_head_impl =
         (DescriptorScriptPubKeyMan *)0x0;
    AddScriptPubKeyMan(this,(uint256 *)&dest,
                       (unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                        )&local_1f0);
    if (local_1f0 != (DescriptorScriptPubKeyMan *)0x0) {
      (*(local_1f0->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[1])();
    }
    local_1f0 = (DescriptorScriptPubKeyMan *)0x0;
  }
  bVar5 = LegacyDataSPKM::DeleteRecords(this_03);
  if (bVar5) {
    (*(this_03->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&dest,this_03);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>,_std::_Select1st<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
    ::erase(&this_00->_M_t,(key_type *)&dest);
    this_05 = this;
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::clear(&(this->m_external_spk_managers)._M_t);
    std::
    _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
    ::clear(&(this->m_internal_spk_managers)._M_t);
    SetWalletFlag(this,0x400000000);
    if (((this_05->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x20 & 1) == 0) {
      if ((data->master_key).key.keydata._M_t.
          super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl ==
          (array<unsigned_char,_32UL> *)0x0) {
        SetupDescriptorScriptPubKeyMans(this_05);
      }
      else {
        SetupDescriptorScriptPubKeyMans(this_05,&data->master_key);
      }
    }
    best_block_locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    best_block_locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    best_block_locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar10 = GetDatabase(this_05);
    (*pWVar10->_vptr_WalletDatabase[0xe])(&dest,pWVar10,1);
    dest.
    super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    .
    super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ._M_u._8_8_ = pWVar10;
    bVar5 = WalletBatch::ReadBestBlock((WalletBatch *)&dest,&best_block_locator);
    if (dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._0_8_ != 0) {
      (**(code **)(*(long *)dest.
                            super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            .
                            super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                            ._M_u._0_8_ + 0x28))();
    }
    if (bVar5) {
      txids_to_delete.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      watchonly_batch._M_t.
      super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>._M_t.
      super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>.
      super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl =
           (__uniq_ptr_data<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>,_true,_true>
            )(__uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>)0x0;
      txids_to_delete.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      txids_to_delete.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      psVar19 = &data->watchonly_wallet;
      pCVar2 = (data->watchonly_wallet).
               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pCVar2 == (CWallet *)0x0) {
LAB_009acf70:
        pCVar2 = (data->solvable_wallet).
                 super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (pCVar2 != (CWallet *)0x0) {
          pWVar10 = GetDatabase(pCVar2);
          (*pWVar10->_vptr_WalletDatabase[0xe])(&dest,pWVar10,1);
          dest.
          super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          .
          super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
          ._M_u._8_8_ = pWVar10;
          bVar5 = WalletBatch::WriteBestBlock((WalletBatch *)&dest,&best_block_locator);
          if (dest.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u._0_8_ != 0) {
            (**(code **)(*(long *)dest.
                                  super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  .
                                  super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                                  ._M_u._0_8_ + 0x28))();
          }
          if (!bVar5) {
            _((bilingual_str *)&dest,(ConstevalStringLiteral)0xe1d645);
            pbVar18 = (bilingual_str *)&dest;
            bilingual_str::operator=(error,pbVar18);
LAB_009ad420:
            bilingual_str::~bilingual_str(pbVar18);
            goto LAB_009ad425;
          }
        }
        p_Var25 = &(data->solvable_wallet).
                   super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>;
        p_Var27 = &(this_05->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header;
        for (p_Var11 = (this_05->wtxOrdered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            p_Var11 != p_Var27;
            p_Var11 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11)) {
          bVar5 = IsMine(this_05,(CTransaction *)p_Var11[1]._M_parent[0xc]._M_right);
          if (!bVar5) {
            bVar5 = IsFromMe(this_05,(CTransaction *)p_Var11[1]._M_parent[0xc]._M_right);
            peVar17 = (psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            if (peVar17 != (element_type *)0x0) goto LAB_009ad046;
            if (bVar5) goto LAB_009ad1fc;
LAB_009ad3a1:
            _((bilingual_str *)&criticalblock68,(ConstevalStringLiteral)0xe1d6bf);
            base_blob<256u>::GetHex_abi_cxx11_
                      ((string *)&dests_to_delete,
                       (base_blob<256u> *)
                       ((long)&p_Var11[1]._M_parent[0xc]._M_right[1]._M_right + 1));
            tinyformat::format<std::__cxx11::string>
                      ((bilingual_str *)&dest,(tinyformat *)&criticalblock68,
                       (bilingual_str *)&dests_to_delete,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
            bilingual_str::operator=(error,(bilingual_str *)&dest);
            bilingual_str::~bilingual_str((bilingual_str *)&dest);
            std::__cxx11::string::~string((string *)&dests_to_delete);
            pbVar18 = (bilingual_str *)&criticalblock68;
            goto LAB_009ad420;
          }
          peVar17 = (psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr;
          bVar5 = true;
          if (peVar17 != (element_type *)0x0) {
LAB_009ad046:
            in_RCX = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
            ;
            UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                      ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&wallets_vec,
                       &peVar17->cs_wallet,"data.watchonly_wallet->cs_wallet",
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                       ,0x1028,false);
            bVar6 = IsMine((psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,(CTransaction *)p_Var11[1]._M_parent[0xc]._M_right);
            if (bVar6) {
LAB_009ad0af:
              dest.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u._0_8_ = p_Var11[1]._M_parent;
              dest.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u._8_8_ = 0;
              hash = (key_type *)
                     ((long)&((_Base_ptr)
                             (dest.
                              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              .
                              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                              ._M_u._0_8_ + 0x180))->_M_right[1]._M_right + 1);
              dest.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u._24_8_ = std::
                             _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:4141:64)>
                             ::_M_invoke;
              dest.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u._16_8_ = std::
                             _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:4141:64)>
                             ::_M_manager;
              bVar6 = LoadToWallet((psVar19->
                                   super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr,hash,(UpdateWalletTxFn *)&dest);
              std::_Function_base::~_Function_base((_Function_base *)&dest);
              this_02 = watchonly_batch;
              if (bVar6) {
                wtx = std::__detail::
                      _Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&((psVar19->
                                super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->mapWallet,hash);
                WalletBatch::WriteTx
                          ((WalletBatch *)
                           this_02._M_t.
                           super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                           .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl,wtx);
                bVar6 = true;
                if (bVar5 == false) {
                  std::vector<uint256,_std::allocator<uint256>_>::push_back(&txids_to_delete,hash);
                  iVar16 = 7;
                  goto LAB_009ad1cb;
                }
                iVar16 = 7;
              }
              else {
                _((bilingual_str *)&criticalblock68,(ConstevalStringLiteral)0xe1d686);
                base_blob<256u>::GetHex_abi_cxx11_
                          ((string *)&dests_to_delete,
                           (base_blob<256u> *)
                           ((long)&p_Var11[1]._M_parent[0xc]._M_right[1]._M_right + 1));
                tinyformat::format<std::__cxx11::string>
                          ((bilingual_str *)&dest,(tinyformat *)&criticalblock68,
                           (bilingual_str *)&dests_to_delete,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_RCX);
                bilingual_str::operator=(error,(bilingual_str *)&dest);
                bilingual_str::~bilingual_str((bilingual_str *)&dest);
                std::__cxx11::string::~string((string *)&dests_to_delete);
                bilingual_str::~bilingual_str((bilingual_str *)&criticalblock68);
                iVar16 = 1;
              }
              bVar6 = true;
            }
            else {
              bVar7 = IsFromMe((psVar19->
                               super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr,(CTransaction *)p_Var11[1]._M_parent[0xc]._M_right);
              bVar6 = false;
              iVar16 = 0;
              if (bVar7) goto LAB_009ad0af;
            }
LAB_009ad1cb:
            std::unique_lock<std::recursive_mutex>::~unique_lock
                      ((unique_lock<std::recursive_mutex> *)&wallets_vec);
            if (bVar5 == false && !bVar6) goto LAB_009ad3a1;
            if (!bVar6) {
              iVar16 = 0;
            }
            if ((iVar16 != 7) && (iVar16 != 0)) goto LAB_009ad425;
          }
LAB_009ad1fc:
        }
        std::__uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::reset
                  ((__uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                    *)&watchonly_batch,(pointer)0x0);
        if (txids_to_delete.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            txids_to_delete.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start) {
          p_Var26 = p_Var25;
          RemoveTxs((Result<void> *)&dest,this_05,&txids_to_delete);
          if (dest.
              super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              .
              super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              ._M_u._64_1_ != '\x01') {
            _(&local_168,(ConstevalStringLiteral)0xe1d712);
            util::ErrorString<void>((bilingual_str *)&dests_to_delete,(Result<void> *)&dest);
            lhs.original._M_string_length = in_stack_fffffffffffffd90;
            lhs.original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
            lhs.original.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
            lhs.original.field_2._8_8_ = this_05;
            lhs.translated._M_dataplus._M_p = (pointer)error;
            lhs.translated._M_string_length._0_4_ = (int)p_Var26;
            lhs.translated._M_string_length._4_4_ = (int)((ulong)p_Var26 >> 0x20);
            lhs.translated.field_2._M_allocated_capacity = (size_type)p_Var27;
            lhs.translated.field_2._8_8_ = in_stack_fffffffffffffdc0;
            ::operator+((bilingual_str *)&criticalblock68,lhs,&local_168);
            bilingual_str::operator=(error,(bilingual_str *)&criticalblock68);
            bilingual_str::~bilingual_str((bilingual_str *)&criticalblock68);
            bilingual_str::~bilingual_str((bilingual_str *)&dests_to_delete);
            bilingual_str::~bilingual_str(&local_168);
            std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
            ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&dest);
            goto LAB_009ad425;
          }
          std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
          ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&dest);
        }
        wallets_vec.
        super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        wallets_vec.
        super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        wallets_vec.
        super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)&dests_to_delete,
                   &psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                   &dests_to_delete.
                    super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,p_Var25);
        for (lVar21 = 0; lVar21 != 0x20; lVar21 = lVar21 + 0x10) {
          psVar19 = (shared_ptr<wallet::CWallet> *)
                    ((long)&dests_to_delete.
                            super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar21);
          pCVar2 = (psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
          ;
          if (pCVar2 != (CWallet *)0x0) {
            GetDatabase(pCVar2);
            std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>((WalletDatabase *)&batch);
            bVar5 = WalletBatch::TxnBegin
                              ((WalletBatch *)
                               batch._M_t.
                               super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                               .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl);
            if (!bVar5) {
              _((bilingual_str *)&criticalblock68,(ConstevalStringLiteral)0xe1d743);
              tinyformat::format<std::__cxx11::string>
                        ((bilingual_str *)&dest,(tinyformat *)&criticalblock68,
                         (bilingual_str *)
                         (*(long *)((long)&dests_to_delete.
                                           super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar21) +
                         0xc0),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_RCX);
              bilingual_str::operator=(error,(bilingual_str *)&dest);
              bilingual_str::~bilingual_str((bilingual_str *)&dest);
              bilingual_str::~bilingual_str((bilingual_str *)&criticalblock68);
              _GLOBAL__N_1::std::
              unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::
              ~unique_ptr((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                           *)&batch);
              break;
            }
            std::
            vector<std::pair<std::shared_ptr<wallet::CWallet>,std::unique_ptr<wallet::WalletBatch,std::default_delete<wallet::WalletBatch>>>,std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,std::unique_ptr<wallet::WalletBatch,std::default_delete<wallet::WalletBatch>>>>>
            ::
            emplace_back<std::shared_ptr<wallet::CWallet>const&,std::unique_ptr<wallet::WalletBatch,std::default_delete<wallet::WalletBatch>>>
                      ((vector<std::pair<std::shared_ptr<wallet::CWallet>,std::unique_ptr<wallet::WalletBatch,std::default_delete<wallet::WalletBatch>>>,std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,std::unique_ptr<wallet::WalletBatch,std::default_delete<wallet::WalletBatch>>>>>
                        *)&wallets_vec,psVar19,&batch);
            _GLOBAL__N_1::std::
            unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::~unique_ptr
                      ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *
                       )&batch);
          }
        }
        lVar14 = 0x18;
        do {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&dests_to_delete.
                             super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar14));
          lVar14 = lVar14 + -0x10;
        } while (lVar14 != -8);
        if (lVar21 == 0x20) {
          dests_to_delete.
          super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          dests_to_delete.
          super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          dests_to_delete.
          super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var27 = &(this_05->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header;
          for (p_Var11 = (this_05->m_address_book)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              ppVar3 = wallets_vec.
                       super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              ppVar15 = wallets_vec.
                        super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, p_Var11 != p_Var27;
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11)) {
            dest_00 = p_Var11 + 1;
            uVar24 = 0;
            if ((*(char *)((long)&p_Var11[4]._M_right + 4) == '\x01') &&
               (*(int *)&p_Var11[4]._M_right == 0)) {
              iVar8 = IsMine(this_05,(CTxDestination *)dest_00);
              uVar24 = (uint)(iVar8 == ISMINE_NO);
            }
            ppVar3 = wallets_vec.
                     super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            strName = (CAddressBookData *)&p_Var11[3]._M_left;
            bVar5 = false;
            for (ppVar15 = wallets_vec.
                           super__Vector_base<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar3;
                ppVar15 = ppVar15 + 1) {
              in_RCX = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
              ;
              UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                        ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&batch,
                         &((ppVar15->first).
                           super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          cs_wallet,"wallet->cs_wallet",
                         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                         ,0x106d,false);
              if (((char)uVar24 == '\0') ||
                 (iVar8 = IsMine((ppVar15->first).
                                 super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,(CTxDestination *)dest_00), iVar8 != ISMINE_NO)) {
                this_04 = std::
                          map<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::pair<const_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_wallet::CAddressBookData>_>_>
                          ::operator[](&((ppVar15->first).
                                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_address_book,(key_type *)dest_00);
                CAddressBookData::operator=(this_04,strName);
                this_01 = (ppVar15->second)._M_t.
                          super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                          .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl;
                EncodeDestination_abi_cxx11_((string *)&dest,(CTxDestination *)dest_00);
                if (*(char *)((long)&p_Var11[4]._M_right + 4) == '\x01') {
                  PurposeToString_abi_cxx11_
                            ((string *)&criticalblock68,
                             (wallet *)(ulong)*(uint *)&p_Var11[4]._M_right,p);
                  WalletBatch::WritePurpose(this_01,(string *)&dest,(string *)&criticalblock68);
                  std::__cxx11::string::~string((string *)&criticalblock68);
                }
                if (*(char *)&p_Var11[4]._M_left == '\x01') {
                  WalletBatch::WriteName(this_01,(string *)&dest,(string *)strName);
                }
                for (p_Var12 = *(_Rb_tree_node_base **)(p_Var11 + 6);
                    p_Var12 != (_Rb_tree_node_base *)&p_Var11[5]._M_left;
                    p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                  in_RCX = (char *)(p_Var12 + 2);
                  WalletBatch::WriteAddressReceiveRequest
                            (this_01,(CTxDestination *)dest_00,(string *)(p_Var12 + 1),
                             (string *)in_RCX);
                }
                if ((char)p_Var11[5]._M_color != _S_red) {
                  WalletBatch::WriteAddressPreviouslySpent(this_01,(CTxDestination *)dest_00,true);
                }
                std::__cxx11::string::~string((string *)&dest);
                bVar5 = true;
                if ((char)uVar24 != '\0') {
                  std::
                  vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                  ::push_back(&dests_to_delete,(value_type *)dest_00);
                  std::unique_lock<std::recursive_mutex>::~unique_lock
                            ((unique_lock<std::recursive_mutex> *)&batch);
                  goto LAB_009ad7dc;
                }
              }
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)&batch);
            }
            if ((~(byte)uVar24 & 1) == 0 && !bVar5) {
              sVar13 = std::
                       set<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                       ::count(&not_migrated_dests,(key_type *)dest_00);
              if (sVar13 == 0) {
                _((bilingual_str *)&dest,(ConstevalStringLiteral)0xe1d780);
                pbVar18 = (bilingual_str *)&dest;
                bilingual_str::operator=(error,pbVar18);
                goto LAB_009ad99f;
              }
              std::
              vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
              ::push_back(&dests_to_delete,(value_type *)dest_00);
            }
LAB_009ad7dc:
          }
LAB_009ad803:
          if (ppVar15 != ppVar3) {
            bVar5 = WalletBatch::TxnCommit
                              ((ppVar15->second)._M_t.
                               super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                               .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl);
            if (bVar5) goto code_r0x009ad819;
            _((bilingual_str *)&criticalblock68,(ConstevalStringLiteral)0xe1d7d6);
            tinyformat::format<std::__cxx11::string>
                      ((bilingual_str *)&dest,(tinyformat *)&criticalblock68,
                       (bilingual_str *)
                       &((ppVar15->first).
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        m_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_RCX);
            bilingual_str::operator=(error,(bilingual_str *)&dest);
            bilingual_str::~bilingual_str((bilingual_str *)&dest);
            pbVar18 = (bilingual_str *)&criticalblock68;
LAB_009ad99f:
            bilingual_str::~bilingual_str(pbVar18);
            bVar5 = false;
            goto LAB_009ad9a6;
          }
          pWVar10 = GetDatabase(this_05);
          (*pWVar10->_vptr_WalletDatabase[0xe])(&criticalblock68,pWVar10,1);
          criticalblock68.super_unique_lock._8_8_ = pWVar10;
          WalletBatch::TxnBegin((WalletBatch *)&criticalblock68);
          pvVar4 = dests_to_delete.
                   super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (dests_to_delete.
              super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              dests_to_delete.
              super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
LAB_009ad923:
            WalletBatch::TxnCommit((WalletBatch *)&criticalblock68);
            ConnectScriptPubKeyManNotifiers(this_05);
            boost::signals2::
            signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
            ::operator()(&this_05->NotifyCanGetAddressesChanged);
            bVar5 = true;
            WalletLogPrintf<>(this_05,"Wallet migration complete.\n");
          }
          else {
            address = dests_to_delete.
                      super__Vector_base<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (address == pvVar4) goto LAB_009ad923;
              bVar5 = DelAddressBookWithDB(this_05,(WalletBatch *)&criticalblock68,address);
              address = address + 1;
            } while (bVar5);
            _((bilingual_str *)&dest,(ConstevalStringLiteral)0xe1d804);
            bilingual_str::operator=(error,(bilingual_str *)&dest);
            bilingual_str::~bilingual_str((bilingual_str *)&dest);
            bVar5 = false;
          }
          if (criticalblock68.super_unique_lock._M_device != (mutex_type *)0x0) {
            (**(code **)(((criticalblock68.super_unique_lock._M_device)->
                         super___recursive_mutex_base)._M_mutex.__align + 0x28))();
          }
LAB_009ad9a6:
          _GLOBAL__N_1::std::
          vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
          ::~vector((vector<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
                     *)&dests_to_delete);
        }
        else {
          bVar5 = false;
        }
        std::
        vector<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>,_std::allocator<std::pair<std::shared_ptr<wallet::CWallet>,_std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>_>_>_>
        ::~vector(&wallets_vec);
      }
      else {
        GetDatabase(pCVar2);
        std::make_unique<wallet::WalletBatch,wallet::WalletDatabase&>((WalletDatabase *)&dest);
        uVar22 = dest.
                 super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 .
                 super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 .
                 super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 .
                 super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 .
                 super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 .
                 super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                 ._M_u._0_8_;
        dest.
        super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        .
        super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ._M_u._0_8_ = 0;
        std::__uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::reset
                  ((__uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                    *)&watchonly_batch,(pointer)uVar22);
        _GLOBAL__N_1::std::
        unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>::~unique_ptr
                  ((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
                   &dest);
        in_RCX = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
        ;
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  (&criticalblock68,
                   &((psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->cs_wallet,"data.watchonly_wallet->cs_wallet",
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                   ,0x1013,false);
        nOrderPosNext = this_05->nOrderPosNext;
        ((psVar19->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        nOrderPosNext = nOrderPosNext;
        WalletBatch::WriteOrderPosNext
                  ((WalletBatch *)
                   watchonly_batch._M_t.
                   super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                   .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl,nOrderPosNext);
        bVar5 = WalletBatch::WriteBestBlock
                          ((WalletBatch *)
                           watchonly_batch._M_t.
                           super___uniq_ptr_impl<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wallet::WalletBatch_*,_std::default_delete<wallet::WalletBatch>_>
                           .super__Head_base<0UL,_wallet::WalletBatch_*,_false>._M_head_impl,
                           &best_block_locator);
        if (bVar5) {
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock68.super_unique_lock);
          goto LAB_009acf70;
        }
        _((bilingual_str *)&dest,(ConstevalStringLiteral)0xe1d603);
        bilingual_str::operator=(error,(bilingual_str *)&dest);
        bilingual_str::~bilingual_str((bilingual_str *)&dest);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock68.super_unique_lock);
LAB_009ad425:
        bVar5 = false;
      }
      _GLOBAL__N_1::std::unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_>
      ::~unique_ptr((unique_ptr<wallet::WalletBatch,_std::default_delete<wallet::WalletBatch>_> *)
                    &watchonly_batch);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                (&txids_to_delete.super__Vector_base<uint256,_std::allocator<uint256>_>);
    }
    else {
      _((bilingual_str *)&dest,(ConstevalStringLiteral)0xe1d5a9);
      bilingual_str::operator=(error,(bilingual_str *)&dest);
      bilingual_str::~bilingual_str((bilingual_str *)&dest);
      bVar5 = false;
    }
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              ((_Vector_base<uint256,_std::allocator<uint256>_> *)&best_block_locator);
  }
  else {
LAB_009ace27:
    bVar5 = false;
  }
  std::
  _Rb_tree<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>,_std::_Identity<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::less<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>,_std::allocator<std::variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>_>_>
  ::~_Rb_tree(&not_migrated_dests._M_t);
LAB_009ad452:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
code_r0x009ad819:
  ppVar15 = ppVar15 + 1;
  goto LAB_009ad803;
}

Assistant:

bool CWallet::ApplyMigrationData(MigrationData& data, bilingual_str& error)
{
    AssertLockHeld(cs_wallet);

    LegacyDataSPKM* legacy_spkm = GetLegacyDataSPKM();
    if (!Assume(legacy_spkm)) {
        // This shouldn't happen
        error = Untranslated(STR_INTERNAL_BUG("Error: Legacy wallet data missing"));
        return false;
    }

    // Get all invalid or non-watched scripts that will not be migrated
    std::set<CTxDestination> not_migrated_dests;
    for (const auto& script : legacy_spkm->GetNotMineScriptPubKeys()) {
        CTxDestination dest;
        if (ExtractDestination(script, dest)) not_migrated_dests.emplace(dest);
    }

    Assume(!m_cached_spks.empty());

    for (auto& desc_spkm : data.desc_spkms) {
        if (m_spk_managers.count(desc_spkm->GetID()) > 0) {
            error = _("Error: Duplicate descriptors created during migration. Your wallet may be corrupted.");
            return false;
        }
        uint256 id = desc_spkm->GetID();
        AddScriptPubKeyMan(id, std::move(desc_spkm));
    }

    // Remove the LegacyScriptPubKeyMan from disk
    if (!legacy_spkm->DeleteRecords()) {
        return false;
    }

    // Remove the LegacyScriptPubKeyMan from memory
    m_spk_managers.erase(legacy_spkm->GetID());
    m_external_spk_managers.clear();
    m_internal_spk_managers.clear();

    // Setup new descriptors
    SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
    if (!IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        // Use the existing master key if we have it
        if (data.master_key.key.IsValid()) {
            SetupDescriptorScriptPubKeyMans(data.master_key);
        } else {
            // Setup with a new seed if we don't.
            SetupDescriptorScriptPubKeyMans();
        }
    }

    // Get best block locator so that we can copy it to the watchonly and solvables
    CBlockLocator best_block_locator;
    if (!WalletBatch(GetDatabase()).ReadBestBlock(best_block_locator)) {
        error = _("Error: Unable to read wallet's best block locator record");
        return false;
    }

    // Check if the transactions in the wallet are still ours. Either they belong here, or they belong in the watchonly wallet.
    // We need to go through these in the tx insertion order so that lookups to spends works.
    std::vector<uint256> txids_to_delete;
    std::unique_ptr<WalletBatch> watchonly_batch;
    if (data.watchonly_wallet) {
        watchonly_batch = std::make_unique<WalletBatch>(data.watchonly_wallet->GetDatabase());
        // Copy the next tx order pos to the watchonly wallet
        LOCK(data.watchonly_wallet->cs_wallet);
        data.watchonly_wallet->nOrderPosNext = nOrderPosNext;
        watchonly_batch->WriteOrderPosNext(data.watchonly_wallet->nOrderPosNext);
        // Write the best block locator to avoid rescanning on reload
        if (!watchonly_batch->WriteBestBlock(best_block_locator)) {
            error = _("Error: Unable to write watchonly wallet best block locator record");
            return false;
        }
    }
    if (data.solvable_wallet) {
        // Write the best block locator to avoid rescanning on reload
        if (!WalletBatch(data.solvable_wallet->GetDatabase()).WriteBestBlock(best_block_locator)) {
            error = _("Error: Unable to write solvable wallet best block locator record");
            return false;
        }
    }
    for (const auto& [_pos, wtx] : wtxOrdered) {
        // Check it is the watchonly wallet's
        // solvable_wallet doesn't need to be checked because transactions for those scripts weren't being watched for
        bool is_mine = IsMine(*wtx->tx) || IsFromMe(*wtx->tx);
        if (data.watchonly_wallet) {
            LOCK(data.watchonly_wallet->cs_wallet);
            if (data.watchonly_wallet->IsMine(*wtx->tx) || data.watchonly_wallet->IsFromMe(*wtx->tx)) {
                // Add to watchonly wallet
                const uint256& hash = wtx->GetHash();
                const CWalletTx& to_copy_wtx = *wtx;
                if (!data.watchonly_wallet->LoadToWallet(hash, [&](CWalletTx& ins_wtx, bool new_tx) EXCLUSIVE_LOCKS_REQUIRED(data.watchonly_wallet->cs_wallet) {
                    if (!new_tx) return false;
                    ins_wtx.SetTx(to_copy_wtx.tx);
                    ins_wtx.CopyFrom(to_copy_wtx);
                    return true;
                })) {
                    error = strprintf(_("Error: Could not add watchonly tx %s to watchonly wallet"), wtx->GetHash().GetHex());
                    return false;
                }
                watchonly_batch->WriteTx(data.watchonly_wallet->mapWallet.at(hash));
                // Mark as to remove from the migrated wallet only if it does not also belong to it
                if (!is_mine) {
                    txids_to_delete.push_back(hash);
                }
                continue;
            }
        }
        if (!is_mine) {
            // Both not ours and not in the watchonly wallet
            error = strprintf(_("Error: Transaction %s in wallet cannot be identified to belong to migrated wallets"), wtx->GetHash().GetHex());
            return false;
        }
    }
    watchonly_batch.reset(); // Flush
    // Do the removes
    if (txids_to_delete.size() > 0) {
        if (auto res = RemoveTxs(txids_to_delete); !res) {
            error = _("Error: Could not delete watchonly transactions. ") + util::ErrorString(res);
            return false;
        }
    }

    // Pair external wallets with their corresponding db handler
    std::vector<std::pair<std::shared_ptr<CWallet>, std::unique_ptr<WalletBatch>>> wallets_vec;
    for (const auto& ext_wallet : {data.watchonly_wallet, data.solvable_wallet}) {
        if (!ext_wallet) continue;

        std::unique_ptr<WalletBatch> batch = std::make_unique<WalletBatch>(ext_wallet->GetDatabase());
        if (!batch->TxnBegin()) {
            error = strprintf(_("Error: database transaction cannot be executed for wallet %s"), ext_wallet->GetName());
            return false;
        }
        wallets_vec.emplace_back(ext_wallet, std::move(batch));
    }

    // Write address book entry to disk
    auto func_store_addr = [](WalletBatch& batch, const CTxDestination& dest, const CAddressBookData& entry) {
        auto address{EncodeDestination(dest)};
        if (entry.purpose) batch.WritePurpose(address, PurposeToString(*entry.purpose));
        if (entry.label) batch.WriteName(address, *entry.label);
        for (const auto& [id, request] : entry.receive_requests) {
            batch.WriteAddressReceiveRequest(dest, id, request);
        }
        if (entry.previously_spent) batch.WriteAddressPreviouslySpent(dest, true);
    };

    // Check the address book data in the same way we did for transactions
    std::vector<CTxDestination> dests_to_delete;
    for (const auto& [dest, record] : m_address_book) {
        // Ensure "receive" entries that are no longer part of the original wallet are transferred to another wallet
        // Entries for everything else ("send") will be cloned to all wallets.
        bool require_transfer = record.purpose == AddressPurpose::RECEIVE && !IsMine(dest);
        bool copied = false;
        for (auto& [wallet, batch] : wallets_vec) {
            LOCK(wallet->cs_wallet);
            if (require_transfer && !wallet->IsMine(dest)) continue;

            // Copy the entire address book entry
            wallet->m_address_book[dest] = record;
            func_store_addr(*batch, dest, record);

            copied = true;
            // Only delete 'receive' records that are no longer part of the original wallet
            if (require_transfer) {
                dests_to_delete.push_back(dest);
                break;
            }
        }

        // Fail immediately if we ever found an entry that was ours and cannot be transferred
        // to any of the created wallets (watch-only, solvable).
        // Means that no inferred descriptor maps to the stored entry. Which mustn't happen.
        if (require_transfer && !copied) {

            // Skip invalid/non-watched scripts that will not be migrated
            if (not_migrated_dests.count(dest) > 0) {
                dests_to_delete.push_back(dest);
                continue;
            }

            error = _("Error: Address book data in wallet cannot be identified to belong to migrated wallets");
            return false;
        }
    }

    // Persist external wallets address book entries
    for (auto& [wallet, batch] : wallets_vec) {
        if (!batch->TxnCommit()) {
            error = strprintf(_("Error: address book copy failed for wallet %s"), wallet->GetName());
            return false;
        }
    }

    // Remove the things to delete in this wallet
    WalletBatch local_wallet_batch(GetDatabase());
    local_wallet_batch.TxnBegin();
    if (dests_to_delete.size() > 0) {
        for (const auto& dest : dests_to_delete) {
            if (!DelAddressBookWithDB(local_wallet_batch, dest)) {
                error = _("Error: Unable to remove watchonly address book data");
                return false;
            }
        }
    }
    local_wallet_batch.TxnCommit();

    // Connect the SPKM signals
    ConnectScriptPubKeyManNotifiers();
    NotifyCanGetAddressesChanged();

    WalletLogPrintf("Wallet migration complete.\n");

    return true;
}